

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

QList<QtGraphicsAnchorLayout::AnchorData_*> *
getVariables(QList<QtGraphicsAnchorLayout::AnchorData_*> *__return_storage_ptr__,
            QList<QSimplexConstraint_*> *constraints)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  Data *pDVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  AnchorData *local_50;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_48;
  QHashDummyValue local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  uVar3 = (constraints->d).size;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      pDVar4 = ((constraints->d).ptr[uVar5]->variables).d;
      if (pDVar4 == (Data *)0x0) {
LAB_005c0c06:
        pDVar4 = (Data *)0x0;
        uVar6 = 0;
LAB_005c0c0b:
        if ((uVar6 != 0) || (pDVar4 != (Data *)0x0)) goto LAB_005c0c19;
      }
      else {
        if (pDVar4->spans->offsets[0] == 0xff) {
          uVar2 = 1;
          do {
            uVar6 = uVar2;
            if (pDVar4->numBuckets == uVar6) goto LAB_005c0c06;
            uVar2 = uVar6 + 1;
          } while (pDVar4->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
          goto LAB_005c0c0b;
        }
        uVar6 = 0;
LAB_005c0c19:
        do {
          lVar1 = *(long *)pDVar4->spans[uVar6 >> 7].entries
                           [pDVar4->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.data;
          local_50 = (AnchorData *)(lVar1 + -8);
          if (lVar1 == 0) {
            local_50 = (AnchorData *)0x0;
          }
          QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::emplace<QHashDummyValue>
                    (&local_48,&local_50,&local_39);
          do {
            if (pDVar4->numBuckets - 1 == uVar6) {
              uVar6 = 0;
              pDVar4 = (Data *)0x0;
              break;
            }
            uVar6 = uVar6 + 1;
          } while (pDVar4->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
        } while ((uVar6 != 0) || (pDVar4 != (Data *)0x0));
        uVar3 = (constraints->d).size;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::values
            (__return_storage_ptr__,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_48);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<AnchorData *> getVariables(const QList<QSimplexConstraint *> &constraints)
{
    QSet<AnchorData *> variableSet;
    for (int i = 0; i < constraints.size(); ++i) {
        const QSimplexConstraint *c = constraints.at(i);
        for (auto it = c->variables.cbegin(), end = c->variables.cend(); it != end; ++it)
            variableSet.insert(static_cast<AnchorData *>(it.key()));
    }
    return variableSet.values();
}